

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

int Abc_NtkClauseAnd(sat_solver *pSat,Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,Vec_Int_t *vVars)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0xe5,"int Abc_NtkClauseAnd(sat_solver *, Abc_Obj_t *, Vec_Ptr_t *, Vec_Int_t *)")
    ;
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0xe6,"int Abc_NtkClauseAnd(sat_solver *, Abc_Obj_t *, Vec_Ptr_t *, Vec_Int_t *)")
    ;
  }
  iVar3 = (pNode->field_6).iTemp;
  if (vSuper->nSize < 1) {
    vVars->nSize = 0;
  }
  else {
    lVar4 = 0;
    do {
      pvVar1 = vSuper->pArray[lVar4];
      iVar2 = *(int *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x40);
      vVars->nSize = 0;
      Vec_IntPush(vVars,((uint)pvVar1 & 1) + iVar2 * 2);
      Vec_IntPush(vVars,iVar3 * 2 + 1);
      iVar2 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
      if (iVar2 == 0) {
        return 0;
      }
      lVar4 = lVar4 + 1;
      iVar2 = vSuper->nSize;
    } while (lVar4 < iVar2);
    vVars->nSize = 0;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        Vec_IntPush(vVars,((uint)vSuper->pArray[lVar4] & 1) +
                          *(int *)(((ulong)vSuper->pArray[lVar4] & 0xfffffffffffffffe) + 0x40) * 2 ^
                          1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vSuper->nSize);
    }
  }
  Vec_IntPush(vVars,iVar3 * 2);
  iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
  return iVar3;
}

Assistant:

int Abc_NtkClauseAnd( sat_solver * pSat, Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, Vec_Int_t * vVars )
{
    int fComp1, Var, Var1, i;
//printf( "Adding AND %d.  (%d)    %d\n", pNode->Id, vSuper->nSize+1, (int)pSat->sat_solver_stats.clauses );

    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_ObjIsNode( pNode ) );

//    nVars = sat_solver_nvars(pSat);
    Var = (int)(ABC_PTRINT_T)pNode->pCopy;
//    Var = pNode->Id;

//    assert( Var  < nVars ); 
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        // get the predecessor nodes
        // get the complemented attributes of the nodes
        fComp1 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]);
        // determine the variable numbers
        Var1 = (int)(ABC_PTRINT_T)Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i])->pCopy;
//        Var1 = (int)Abc_ObjRegular(vSuper->pArray[i])->Id;

        // check that the variables are in the SAT manager
//        assert( Var1 < nVars );

        // suppose the AND-gate is A * B = C
        // add !A => !C   or   A + !C
    //  fprintf( pFile, "%d %d 0%c", Var1, -Var, 10 );
        vVars->nSize = 0;
        Vec_IntPush( vVars, toLitCond(Var1, fComp1) );
        Vec_IntPush( vVars, toLitCond(Var,  1     ) );
        if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
            return 0;
    }

    // add A & B => C   or   !A + !B + C
//  fprintf( pFile, "%d %d %d 0%c", -Var1, -Var2, Var, 10 );
    vVars->nSize = 0;
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        // get the predecessor nodes
        // get the complemented attributes of the nodes
        fComp1 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]);
        // determine the variable numbers
        Var1 = (int)(ABC_PTRINT_T)Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i])->pCopy;
//        Var1 = (int)Abc_ObjRegular(vSuper->pArray[i])->Id;
        // add this variable to the array
        Vec_IntPush( vVars, toLitCond(Var1, !fComp1) );
    }
    Vec_IntPush( vVars, toLitCond(Var, 0) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}